

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

int64_t number_from_hex(char *s,uint32_t len)

{
  uint32_t len_local;
  char *s_local;
  
  if (len < 0x19) {
    s_local = (char *)strtoll(s,(char **)0x0,0x10);
  }
  else {
    s_local = (char *)0x0;
  }
  return (int64_t)s_local;
}

Assistant:

int64_t number_from_hex (const char *s, uint32_t len) {
    // LLONG_MIN  = -9223372036854775808
    // LLONG_MAX  = +9223372036854775807
    // HEX(9223372036854775808) = 346DC5D638865
    
    // sanity check on len in order to workaround an address sanitizer error
    if (len > 24) return 0;
    return (int64_t) strtoll(s, NULL, 16);
}